

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tron.cpp
# Opt level: O0

void __thiscall TRON::info(TRON *this,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_20e8 [16];
  undefined8 local_20d8;
  undefined8 local_20d0;
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined4 local_2038;
  undefined4 local_2034;
  va_list ap;
  char local_2018 [8];
  char buf [8192];
  char *fmt_local;
  TRON *this_local;
  
  if (in_AL != '\0') {
    local_20b8 = in_XMM0_Qa;
    local_20a8 = in_XMM1_Qa;
    local_2098 = in_XMM2_Qa;
    local_2088 = in_XMM3_Qa;
    local_2078 = in_XMM4_Qa;
    local_2068 = in_XMM5_Qa;
    local_2058 = in_XMM6_Qa;
    local_2048 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_20e8;
  ap[0]._0_8_ = &stack0x00000008;
  local_2034 = 0x30;
  local_2038 = 0x10;
  local_20d8 = in_RDX;
  local_20d0 = in_RCX;
  local_20c8 = in_R8;
  local_20c0 = in_R9;
  buf._8184_8_ = fmt;
  vsprintf(local_2018,fmt,&local_2038);
  (*this->tron_print_string)(local_2018);
  return;
}

Assistant:

void TRON::info(const char *fmt,...)
{
	char buf[BUFSIZ];
	va_list ap;
	va_start(ap,fmt);
	vsprintf(buf,fmt,ap);
	va_end(ap);
	(*tron_print_string)(buf);
}